

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_1,_3,_1,_1,_3> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
_set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
          (PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *other)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_9;
  
  internal::
  call_dense_assignment_loop<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_1,_3,_1,_1,_3> *)this,
             (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other,&local_9);
  return (Matrix<double,_1,_3,_1,_1,_3> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }